

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::ProgramExpr::ProgramExpr
          (ProgramExpr *this,Lexer *lexer,Position *pos,Token *progName,Exprs *imports,Exprs *defs)

{
  Exprs *defs_local;
  Exprs *imports_local;
  Token *progName_local;
  Position *pos_local;
  Lexer *lexer_local;
  ProgramExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_PROG,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ProgramExpr_001766f0;
  this->progName = progName;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->imports,imports);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->defs,defs);
  _setParents<pfederc::Expr>(imports,&this->super_Expr);
  _setParents<pfederc::Expr>(defs,&this->super_Expr);
  return;
}

Assistant:

ProgramExpr::ProgramExpr(const Lexer &lexer, const Position &pos,
    const Token *progName,
    Exprs &&imports,
    Exprs &&defs) noexcept
    : Expr(lexer, ExprType::EXPR_PROG, pos),
      progName{progName},
      imports(std::move(imports)),
      defs(std::move(defs)) {
  
  _setParents(imports, this);
  _setParents(defs, this);
}